

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::resolveImport
          (Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *__return_storage_ptr__,
          Node *this,StringPtr name)

{
  Which WVar1;
  Maybe<capnp::compiler::Compiler::CompiledModule_&> MVar2;
  
  MVar2 = CompiledModule::importRelative(this->module,name);
  if (MVar2.ptr != (CompiledModule *)0x0) {
    WVar1 = ((MVar2.ptr)->rootNode).kind;
    (__return_storage_ptr__->ptr).field_1.value.id = ((MVar2.ptr)->rootNode).id;
    (__return_storage_ptr__->ptr).field_1.value.genericParamCount = 0;
    (__return_storage_ptr__->ptr).field_1.value.scopeId = 0;
    (__return_storage_ptr__->ptr).field_1.value.kind = WVar1;
    (__return_storage_ptr__->ptr).field_1.value.resolver = &((MVar2.ptr)->rootNode).super_Resolver;
    (__return_storage_ptr__->ptr).field_1.value.brand.ptr.isSet = false;
  }
  (__return_storage_ptr__->ptr).isSet = MVar2.ptr != (CompiledModule *)0x0;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolvedDecl>
Compiler::Node::resolveImport(kj::StringPtr name) {
  KJ_IF_MAYBE(m, module->importRelative(name)) {
    Node& root = m->getRootNode();
    return ResolvedDecl { root.id, 0, 0, root.kind, &root, nullptr };
  } else {
    return nullptr;
  }
}